

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll-close.c
# Opt level: O2

int run_test_poll_close(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  char *pcVar4;
  uv_poll_t *handle;
  long lVar5;
  undefined8 uVar6;
  int64_t eval_b;
  int64_t eval_a;
  uv_poll_t poll_handles [64];
  
  for (lVar5 = 0; lVar5 != 0x2000; lVar5 = lVar5 + 0x80) {
    iVar1 = socket(2,1,0);
    puVar2 = uv_default_loop();
    handle = (uv_poll_t *)((long)&poll_handles[0].data + lVar5);
    uv_poll_init(puVar2,handle,iVar1);
    uv_poll_start(handle,3,(uv_poll_cb)0x0);
  }
  for (lVar5 = 0; lVar5 != 0x2000; lVar5 = lVar5 + 0x80) {
    uv_close((uv_handle_t *)((long)&poll_handles[0].data + lVar5),close_cb);
  }
  puVar2 = uv_default_loop();
  uv_run(puVar2,UV_RUN_DEFAULT);
  eval_a = (int64_t)close_cb_called;
  eval_b = 0x40;
  if (eval_a == 0x40) {
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    uv_run(puVar2,UV_RUN_DEFAULT);
    eval_a = 0;
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    eval_b = (int64_t)iVar1;
    if (eval_b == 0) {
      uv_library_shutdown();
      return 0;
    }
    pcVar4 = "uv_loop_close(uv_default_loop())";
    pcVar3 = "0";
    uVar6 = 0x47;
  }
  else {
    pcVar4 = "64";
    pcVar3 = "close_cb_called";
    uVar6 = 0x45;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-close.c"
          ,uVar6,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(poll_close) {
  uv_os_sock_t sockets[NUM_SOCKETS];
  uv_poll_t poll_handles[NUM_SOCKETS];
  int i;

#ifdef _WIN32
  {
    struct WSAData wsa_data;
    int r = WSAStartup(MAKEWORD(2, 2), &wsa_data);
    ASSERT_OK(r);
  }
#endif

  for (i = 0; i < NUM_SOCKETS; i++) {
    sockets[i] = socket(AF_INET, SOCK_STREAM, 0);
    uv_poll_init(uv_default_loop(), &poll_handles[i], sockets[i]);
    uv_poll_start(&poll_handles[i], UV_READABLE | UV_WRITABLE, NULL);
  }

  for (i = 0; i < NUM_SOCKETS; i++) {
    uv_close((uv_handle_t*) &poll_handles[i], close_cb);
  }

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(close_cb_called, NUM_SOCKETS);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}